

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_tables.cpp
# Opt level: O0

void __thiscall YAJLHuffmanTable::YAJLHuffmanTable(YAJLHuffmanTable *this,bitio_stream *bstream)

{
  size_t sVar1;
  ssize_t sVar2;
  u8 uVar3;
  undefined1 in_DL;
  undefined1 extraout_DL;
  u8 extraout_DL_00;
  undefined7 in_register_00000011;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar4;
  undefined7 extraout_var_01;
  int local_1c;
  int i;
  bitio_stream *bstream_local;
  YAJLHuffmanTable *this_local;
  
  this->tree = (HFTree *)0x0;
  this->bstream = bstream;
  sVar1 = bitio::bitio_stream::read
                    (bstream,4,(void *)CONCAT71(in_register_00000011,in_DL),(size_t)bstream);
  this->table_class = (u8)sVar1;
  sVar1 = bitio::bitio_stream::read(bstream,4,(void *)CONCAT71(extraout_var,extraout_DL),sVar1);
  this->table_dest = (u8)sVar1;
  uVar3 = extraout_DL_00;
  uVar4 = extraout_var_00;
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    sVar2 = bitio::bitio_stream::read(bstream,8,(void *)CONCAT71(uVar4,uVar3),sVar1);
    uVar3 = (u8)sVar2;
    sVar1 = (size_t)local_1c;
    this->ncodes[sVar1] = uVar3;
    uVar4 = extraout_var_01;
  }
  decode_table(this);
  return;
}

Assistant:

YAJLHuffmanTable::YAJLHuffmanTable(bitio::bitio_stream *bstream) {
    this->bstream = bstream;
    table_class = bstream->read(0x4);
    table_dest = bstream->read(0x4);

    for (int i = 0; i < 16; i++) {
        ncodes[i] = bstream->read(0x8);
    }

    decode_table();
}